

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O0

void av1_alloc_cdef_sync(AV1_COMMON *cm,AV1CdefSync *cdef_sync,int num_workers)

{
  void *pvVar1;
  int in_EDX;
  long *in_RSI;
  long in_RDI;
  
  if ((0 < in_EDX) && (*in_RSI == 0)) {
    pvVar1 = aom_malloc(0x1798de2);
    *in_RSI = (long)pvVar1;
    if (*in_RSI == 0) {
      aom_internal_error(*(aom_internal_error_info **)(in_RDI + 0x30),AOM_CODEC_MEM_ERROR,
                         "Failed to allocate cdef_sync->mutex_");
    }
    if (*in_RSI != 0) {
      pthread_mutex_init((pthread_mutex_t *)*in_RSI,(pthread_mutexattr_t *)0x0);
    }
  }
  return;
}

Assistant:

void av1_alloc_cdef_sync(AV1_COMMON *const cm, AV1CdefSync *cdef_sync,
                         int num_workers) {
  if (num_workers < 1) return;
#if CONFIG_MULTITHREAD
  if (cdef_sync->mutex_ == NULL) {
    CHECK_MEM_ERROR(cm, cdef_sync->mutex_,
                    aom_malloc(sizeof(*(cdef_sync->mutex_))));
    if (cdef_sync->mutex_) pthread_mutex_init(cdef_sync->mutex_, NULL);
  }
#else
  (void)cm;
  (void)cdef_sync;
#endif  // CONFIG_MULTITHREAD
}